

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
          (Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *this,TaskFunc func,Expression **currp)

{
  Expression **local_20;
  Expression **currp_local;
  TaskFunc func_local;
  Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *this_local;
  
  local_20 = currp;
  currp_local = (Expression **)func;
  func_local = (TaskFunc)this;
  if (*currp != (Expression *)0x0) {
    SmallVector<wasm::Walker<wasm::LocalStructuralDominance::LocalStructuralDominance(wasm::Function*,wasm::Module&,wasm::LocalStructuralDominance::Mode)::Scanner,wasm::Visitor<wasm::LocalStructuralDominance::LocalStructuralDominance(wasm::Function*,wasm::Module&,wasm::LocalStructuralDominance::Mode)::Scanner,void>>::Task,10ul>
    ::
    emplace_back<void(*&)(wasm::LocalStructuralDominance::LocalStructuralDominance(wasm::Function*,wasm::Module&,wasm::LocalStructuralDominance::Mode)::Scanner*,wasm::Expression**),wasm::Expression**&>
              ((SmallVector<wasm::Walker<wasm::LocalStructuralDominance::LocalStructuralDominance(wasm::Function*,wasm::Module&,wasm::LocalStructuralDominance::Mode)::Scanner,wasm::Visitor<wasm::LocalStructuralDominance::LocalStructuralDominance(wasm::Function*,wasm::Module&,wasm::LocalStructuralDominance::Mode)::Scanner,void>>::Task,10ul>
                *)&this->stack,(_func_void_Scanner_ptr_Expression_ptr_ptr_conflict **)&currp_local,
               &local_20);
    return;
  }
  __assert_fail("*currp",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x11e,
                "void wasm::Walker<Scanner, wasm::Visitor<Scanner>>::pushTask(TaskFunc, Expression **) [SubType = Scanner, VisitorType = wasm::Visitor<Scanner>]"
               );
}

Assistant:

void pushTask(TaskFunc func, Expression** currp) {
    assert(*currp);
    stack.emplace_back(func, currp);
  }